

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LicenseReader.cpp
# Opt level: O0

EventRegistry * __thiscall
license::LicenseReader::getLicenseDiskFiles
          (EventRegistry *__return_storage_ptr__,LicenseReader *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *diskFiles)

{
  bool bVar1;
  byte bVar2;
  bool bVar3;
  char *pcVar4;
  int *piVar5;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double __x;
  undefined1 auStack_1290 [7];
  bool licenseFileFoundWithEnvVariable;
  ifstream f;
  allocator local_1081;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1080;
  undefined1 local_1060 [8];
  string temptativeLicense;
  char local_1038 [4];
  FUNCTION_RETURN fret;
  char fname [4096];
  bool foundNearModule;
  bool licenseFoundWithExplicitLocation;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *diskFiles_local;
  LicenseReader *this_local;
  EventRegistry *eventRegistry;
  
  EventRegistry::EventRegistry(__return_storage_ptr__);
  bVar1 = findLicenseWithExplicitLocation(this,diskFiles,__return_storage_ptr__);
  fname[0xffb] = '\0';
  if (((this->licenseLocation).openFileNearModule & 1U) != 0) {
    memset(local_1038,0,0x1000);
    temptativeLicense.field_2._12_4_ = getModuleName(local_1038);
    if (temptativeLicense.field_2._12_4_ == FUNC_RET_OK) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1080,local_1038,&local_1081);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1060
                     ,&local_1080,".lic");
      std::__cxx11::string::~string((string *)&local_1080);
      std::allocator<char>::~allocator((allocator<char> *)&local_1081);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      std::ifstream::ifstream(auStack_1290,pcVar4,_S_in);
      bVar2 = std::ios::good();
      if ((bVar2 & 1) == 0) {
        EventRegistry::addEvent
                  (__return_storage_ptr__,LICENSE_FILE_NOT_FOUND,SVRT_WARN,(string *)local_1060);
      }
      else {
        fname[0xffb] = '\x01';
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(diskFiles,(value_type *)local_1060);
        EventRegistry::addEvent
                  (__return_storage_ptr__,LICENSE_FILE_FOUND,SVRT_INFO,(string *)local_1060);
      }
      std::ifstream::close();
      std::ifstream::~ifstream(auStack_1290);
      std::__cxx11::string::~string((string *)local_1060);
    }
    else {
      piVar5 = __errno_location();
      __x = extraout_XMM0_Qa;
      if (*piVar5 != 0) {
        piVar5 = __errno_location();
        strerror(*piVar5);
        __x = extraout_XMM0_Qa_00;
      }
      _log(__x);
    }
  }
  bVar3 = findFileWithEnvironmentVariable(this,diskFiles,__return_storage_ptr__);
  if ((((fname[0xffb] & 1U) == 0) && (!bVar1)) && (!bVar3)) {
    EventRegistry::turnEventIntoError(__return_storage_ptr__,ENVIRONMENT_VARIABLE_NOT_DEFINED);
    EventRegistry::turnEventIntoError(__return_storage_ptr__,LICENSE_FILE_NOT_FOUND);
  }
  return __return_storage_ptr__;
}

Assistant:

EventRegistry LicenseReader::getLicenseDiskFiles(vector<string>& diskFiles) {
	EventRegistry eventRegistry;
	bool licenseFoundWithExplicitLocation = findLicenseWithExplicitLocation(
			diskFiles, eventRegistry);
	bool foundNearModule = false;
	if (licenseLocation.openFileNearModule) {
		char fname[MAX_PATH] = { 0 };
		FUNCTION_RETURN fret = getModuleName(fname);
		if (fret == FUNC_RET_OK) {
			string temptativeLicense = string(fname) + ".lic";
			ifstream f(temptativeLicense.c_str());
			if (f.good()) {
				foundNearModule = true;
				diskFiles.push_back(temptativeLicense);
				eventRegistry.addEvent(LICENSE_FILE_FOUND, SVRT_INFO,
						temptativeLicense);
			} else {
				eventRegistry.addEvent(LICENSE_FILE_NOT_FOUND, SVRT_WARN,
						temptativeLicense);
			}
			f.close();
		} else {
			LOG_WARN("Error determining module name.");
		}
	}
	bool licenseFileFoundWithEnvVariable = findFileWithEnvironmentVariable(
			diskFiles, eventRegistry);

	if (!foundNearModule && !licenseFoundWithExplicitLocation
			&& !licenseFileFoundWithEnvVariable) {
		eventRegistry.turnEventIntoError(ENVIRONMENT_VARIABLE_NOT_DEFINED);
		eventRegistry.turnEventIntoError(LICENSE_FILE_NOT_FOUND);
	}
	return eventRegistry;
}